

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int modelInPattern(pattern *pat)

{
  int iVar1;
  
  if (pat == (pattern *)0x0) {
    modelInPattern::model = 0;
  }
  else {
    iVar1 = pat->type;
    if (iVar1 - 300U < 2) {
      modelInPattern::ireturn = modelInPattern(pat->rhs);
    }
    else if (iVar1 != 0x12e) {
      if (iVar1 == 0x131) {
        modelInPattern::model = pat->val;
      }
      goto LAB_00125daf;
    }
    modelInPattern::ireturn = modelInPattern(pat->lhs);
  }
LAB_00125daf:
  if (0 < modelInPattern::model) {
    modelInPattern::ireturn = modelInPattern::model;
  }
  return modelInPattern::ireturn;
}

Assistant:

int  modelInPattern(pattern *pat) 
{
 static  int model=0;
 static  int ireturn=0;

   if(pat == NULL) {model=0;}
   else
   {
      switch(pat->type) 
      {
         case OR_NODE:
         case AND_NODE:
            ireturn = modelInPattern(pat->rhs);
         case NOT_NODE:
            ireturn = modelInPattern(pat->lhs);
         break;
         case MODEL_NODE:
            model = pat->val;
         break;
      }/*switch*/
   }
   if(model>0){ireturn = model;}
   return(ireturn);
}